

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O1

Index __thiscall
ObservationModelDiscrete::SampleJointObservation
          (ObservationModelDiscrete *this,Index jaI,Index sucI)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = rand();
  if (0 < this->_m_nrJointObservations) {
    dVar4 = 0.0;
    uVar3 = 0;
    do {
      dVar5 = dVar4;
      (*(this->super_ObservationModelDiscreteInterface).super_ObservationModel.
        _vptr_ObservationModel[4])(this,jaI,(ulong)sucI,uVar3);
      dVar4 = dVar4 + dVar5;
      if ((double)iVar1 * 4.656612873077393e-10 <= dVar4) {
        return (Index)uVar3;
      }
      uVar2 = (Index)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 < this->_m_nrJointObservations);
  }
  return 0;
}

Assistant:

Index ObservationModelDiscrete::SampleJointObservation(Index jaI, Index sucI)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index jo=0;
    int i;
    
    for(i=0;i<_m_nrJointObservations;i++)
    {
        sum+=Get(jaI,sucI,i);
        if(randNr<=sum)
        {
            jo=i;
            break;
        }
    }
    
    return(jo);
}